

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Vec_Ptr_t * Aig_ManRegPartitionSmart(Aig_Man_t *pAig,int nPartSize)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  int iVar5;
  Aig_ManPre_t *p;
  int *Entry;
  void *__dest;
  size_t __size;
  
  p = Aig_ManRegManStart(pAig,nPartSize);
  do {
    iVar4 = Aig_ManRegFindSeed(p);
    if (iVar4 < 0) {
      pVVar3 = p->vParts;
      p->vParts = (Vec_Ptr_t *)0x0;
      Aig_ManRegManStop(p);
      return pVVar3;
    }
    pVVar1 = p->vRegs;
    pVVar1->nSize = 0;
    p->vUniques->nSize = 0;
    pVVar2 = p->vFreeVars;
    pVVar2->nSize = 0;
    p->vPartCost->nSize = 0;
    memset(p->pfPartVars,0,(long)p->pAig->nRegs);
    Aig_ManRegPartitionAdd(p,iVar4);
    iVar4 = p->nRegsMax;
    do {
      iVar5 = pVVar1->nSize;
      if (iVar4 <= iVar5) goto LAB_00529cf5;
      iVar5 = Aig_ManRegFindBestVar(p);
      if (iVar5 == -1) break;
      Aig_ManRegPartitionAdd(p,iVar5);
    } while (pVVar2->nSize != 0);
    iVar5 = pVVar1->nSize;
LAB_00529cf5:
    pVVar3 = p->vParts;
    Entry = (int *)malloc(0x10);
    Entry[1] = iVar5;
    *Entry = iVar5;
    if (iVar5 == 0) {
      __size = 0;
      __dest = (void *)0x0;
    }
    else {
      __size = (long)iVar5 << 2;
      __dest = malloc(__size);
    }
    *(void **)(Entry + 2) = __dest;
    memcpy(__dest,pVVar1->pArray,__size);
    Vec_PtrPush(pVVar3,Entry);
    printf("Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n",
           (double)pVVar2->nSize / (double)pVVar1->nSize);
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSmart( Aig_Man_t * pAig, int nPartSize )
{
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );

    Aig_ManPre_t * p;
    Vec_Ptr_t * vResult;
    int iSeed, iNext, i, k;
    // create the manager
    p = Aig_ManRegManStart( pAig, nPartSize );
    // add partitions as long as registers remain
    for ( i = 0; (iSeed = Aig_ManRegFindSeed(p)) >= 0; i++ )
    {
//printf( "Seed variable = %d.\n", iSeed );
        // clean the current partition information
        Vec_IntClear( p->vRegs );
        Vec_IntClear( p->vUniques );
        Vec_IntClear( p->vFreeVars );
        Vec_FltClear( p->vPartCost );
        memset( p->pfPartVars, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
        // add the register and its partition support
        Aig_ManRegPartitionAdd( p, iSeed );
        // select the best var to add
        for ( k = 0; Vec_IntSize(p->vRegs) < p->nRegsMax; k++ )
        {
            // get the next best variable
            iNext = Aig_ManRegFindBestVar( p );
            if ( iNext == -1 )
                break;
            // add the register to the support of the partition
            Aig_ManRegPartitionAdd( p, iNext );
            // report the result
//printf( "Part %3d  Reg %3d : Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i, k, 
//                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
//                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
            // quit if there are not free variables
            if ( Vec_IntSize(p->vFreeVars) == 0 )
                break;
        }
        // add this partition to the set
        Vec_PtrPush( p->vParts, Vec_IntDup(p->vRegs) );        
printf( "Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i,
                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
//printf( "\n" ); 
    }
    vResult = p->vParts; p->vParts = NULL;
    Aig_ManRegManStop( p );
    return vResult;
}